

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O0

void emitter_json_object_end(emitter_t *emitter)

{
  _Bool _Var1;
  emitter_t *in_RDI;
  emitter_t *in_stack_00000010;
  
  _Var1 = emitter_outputs_json(in_RDI);
  if (_Var1) {
    emitter_nest_dec(in_RDI);
    if (in_RDI->output != emitter_output_json_compact) {
      emitter_printf(in_RDI,anon_var_dwarf_3eb6436 + 8);
      emitter_indent(in_stack_00000010);
    }
    emitter_printf(in_RDI,"}");
  }
  return;
}

Assistant:

static inline void
emitter_json_object_end(emitter_t *emitter) {
	if (emitter_outputs_json(emitter)) {
		assert(emitter->nesting_depth > 0);
		emitter_nest_dec(emitter);
		if (emitter->output != emitter_output_json_compact) {
			emitter_printf(emitter, "\n");
			emitter_indent(emitter);
		}
		emitter_printf(emitter, "}");
	}
}